

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall r_comp::Decompiler::write_icmd(Decompiler *this,uint16_t read_index)

{
  Metadata *this_00;
  byte bVar1;
  short sVar2;
  short sVar3;
  char local_5e [2];
  ushort local_5c;
  bool local_59;
  ushort local_58;
  ushort local_56;
  uint16_t i;
  bool after_tail_wildcard;
  uint16_t arity;
  uint16_t arg_set_index;
  allocator local_41;
  string local_40 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_20;
  uint16_t local_16;
  char local_13;
  uint16_t local_12;
  uint16_t write_as_view_index;
  Decompiler *pDStack_10;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  local_12 = read_index;
  pDStack_10 = this;
  if ((this->closing_set & 1U) != 0) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_13 = '(';
  OutStream::push<char>(this->out_stream,&local_13,local_12);
  write_expression_head(this,local_12);
  local_16 = 0;
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(local_12 + 1));
  sVar2 = r_code::Atom::asOpcode();
  this_00 = this->metadata;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"_inj",&local_41);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
       ::find(&this_00->classes,(key_type *)local_40);
  std::__detail::
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                *)&local_20);
  sVar3 = r_code::Atom::asOpcode();
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (sVar2 == sVar3) {
    r_code::vector<r_code::Atom>::operator[]
              ((vector<r_code::Atom> *)(this->current_object + 8),(long)(int)(local_12 + 2));
    local_56 = r_code::Atom::asIndex();
    r_code::vector<r_code::Atom>::operator[]
              ((vector<r_code::Atom> *)(this->current_object + 8),(long)(int)(local_56 + 2));
    local_16 = r_code::Atom::asIndex();
  }
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)local_12);
  bVar1 = r_code::Atom::getAtomCount();
  local_58 = (ushort)bVar1;
  local_59 = false;
  for (local_5c = 0; local_5c < local_58; local_5c = local_5c + 1) {
    if ((local_59 & 1U) == 0) {
      if ((this->closing_set & 1U) == 0) {
        local_5e[1] = 0x20;
        OutStream::operator<<(this->out_stream,local_5e + 1);
      }
      else {
        this->closing_set = false;
        write_indent(this,this->indents);
      }
      local_12 = local_12 + 1;
      write_any(this,local_12,&local_59,true,local_16);
    }
    else {
      local_12 = local_12 + 1;
      write_any(this,local_12,&local_59,true,0);
    }
  }
  if ((this->closing_set & 1U) != 0) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_5e[0] = ')';
  OutStream::operator<<(this->out_stream,local_5e);
  return;
}

Assistant:

void Decompiler::write_icmd(uint16_t read_index)
{
    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    //write_expression_tail(read_index,true);
    uint16_t write_as_view_index = 0;

    if (current_object->code[read_index + 1].asOpcode() == metadata->classes.find("_inj")->second.atom.asOpcode()) {
        uint16_t arg_set_index = current_object->code[read_index + 2].asIndex(); // 2 args for _inj; the view is the second.
        write_as_view_index = current_object->code[arg_set_index + 2].asIndex();
    }

    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    for (uint16_t i = 0; i < arity; ++i) {
        if (after_tail_wildcard) {
            write_any(++read_index, after_tail_wildcard, true);
        } else {
            if (closing_set) {
                closing_set = false;
                write_indent(indents);
            } else {
                *out_stream << ' ';
            }

            write_any(++read_index, after_tail_wildcard, true, write_as_view_index);
        }
    }

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';
}